

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.h
# Opt level: O0

uint __thiscall
mvm::
interpreter<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
::consume_bytecode<mvm::bytecode_serializer,unsigned_int>
          (interpreter<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
           *this)

{
  bool bVar1;
  uint uVar2;
  mexcept *this_00;
  bytecode_serializer *this_01;
  allocator<char> local_39;
  string local_38;
  uint8_t *local_18;
  uint8_t *ip;
  interpreter<mvm::test::test_instr_set,_mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,_mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>_>_>
  *this_local;
  
  ip = (uint8_t *)this;
  local_18 = rebasable_ip::operator_cast_to_unsigned_char_((rebasable_ip *)(this + 0x20));
  mvm::ip::operator+=((ip *)(this + 0x20),4);
  bVar1 = rebasable_ip::assert_in_chunk((rebasable_ip *)(this + 0x20));
  if (!bVar1) {
    this_00 = (mexcept *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"[-][mvm] bytecode overflow",&local_39);
    mexcept::mexcept(this_00,&local_38,CODE_OVERFLOW);
    __cxa_throw(this_00,&mexcept::typeinfo,mexcept::~mexcept);
  }
  this_01 = std::
            get<mvm::bytecode_serializer,mvm::bytecode_serializer,mvm::value_stack<mvm::list::mplist<unsigned_int>>>
                      ((tuple<mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>
                        *)(this + 8));
  uVar2 = bytecode_serializer::parse<unsigned_int,4ul,mvm::num::little_endian_tag>
                    (this_01,local_18 + 1);
  return uVar2;
}

Assistant:

auto consume_bytecode() {
    uint8_t *ip = m_rebased_ip;
    m_rebased_ip += instr_set_traits_type::template type_size<DataType>;

    if (!m_rebased_ip.assert_in_chunk()) {
      throw mexcept("[-][mvm] bytecode overflow", status_type::CODE_OVERFLOW);
    }

    return std::get<IS>(m_instances)
        .template parse<
            DataType, instr_set_traits_type::template type_size<DataType>,
            typename instr_set_traits_type::template type_endianness<DataType>>(
            ip + 1);
  }